

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadSkeleton(OgreXmlSerializer *this,Skeleton *skeleton)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  string *psVar4;
  Logger *this_00;
  undefined4 extraout_var;
  runtime_error *this_01;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type sVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar4 = NextNode_abi_cxx11_(this);
  iVar3 = std::__cxx11::string::compare((char *)psVar4);
  if (iVar3 == 0) {
    this_00 = DefaultLogger::get();
    Logger::debug(this_00,"Reading Skeleton");
    iVar3 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"blendmode");
    if (CONCAT44(extraout_var,iVar3) != 0) {
      ReadAttribute<std::__cxx11::string>(&local_70,this,"blendmode");
      sVar2 = local_70._M_string_length;
      _Var1._M_p = local_70._M_dataplus._M_p;
      if (local_70._M_string_length != 0) {
        sVar7 = 0;
        do {
          iVar3 = tolower((int)_Var1._M_p[sVar7]);
          _Var1._M_p[sVar7] = (char)iVar3;
          sVar7 = sVar7 + 1;
        } while (sVar2 != sVar7);
      }
      paVar6 = &local_70.field_2;
      local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == paVar6) {
        local_80._8_8_ = local_70.field_2._8_8_;
        local_90 = &local_80;
      }
      local_80._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
      local_80._M_local_buf[0] = local_70.field_2._M_local_buf[0];
      local_88 = local_70._M_string_length;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)paVar6;
      iVar3 = std::__cxx11::string::compare((char *)&local_90);
      skeleton->blendMode = (uint)(iVar3 == 0);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar6) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
    }
    NextNode_abi_cxx11_(this);
    psVar4 = &this->m_currentNodeName;
    while ((((iVar3 = std::__cxx11::string::compare((char *)psVar4), iVar3 == 0 ||
             (iVar3 = std::__cxx11::string::compare((char *)psVar4), iVar3 == 0)) ||
            (iVar3 = std::__cxx11::string::compare((char *)psVar4), iVar3 == 0)) ||
           (iVar3 = std::__cxx11::string::compare((char *)psVar4), iVar3 == 0))) {
      iVar3 = std::__cxx11::string::compare((char *)psVar4);
      if (iVar3 == 0) {
        ReadBones(this,skeleton);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)psVar4);
        if (iVar3 == 0) {
          ReadBoneHierarchy(this,skeleton);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar3 == 0) {
            ReadAnimations(this,skeleton);
          }
          else {
            SkipCurrentNode_abi_cxx11_(this);
          }
        }
      }
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Root node is <",&this->m_currentNodeName);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar5;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if (local_90 == paVar6) {
    local_80._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_80._8_8_ = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)paVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::runtime_error::runtime_error(this_01,(string *)&local_90);
  *(undefined ***)this_01 = &PTR__runtime_error_0080bf48;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreXmlSerializer::ReadSkeleton(Skeleton *skeleton)
{
    if (NextNode() != nnSkeleton) {
        throw DeadlyImportError("Root node is <" + m_currentNodeName + "> expecting <skeleton>");
    }

    ASSIMP_LOG_DEBUG("Reading Skeleton");

    // Optional blend mode from root node
    if (HasAttribute("blendmode")) {
        skeleton->blendMode = (ToLower(ReadAttribute<std::string>("blendmode")) == "cumulative"
            ? Skeleton::ANIMBLEND_CUMULATIVE : Skeleton::ANIMBLEND_AVERAGE);
    }

    NextNode();

    // Root level nodes
    while(m_currentNodeName == nnBones         ||
          m_currentNodeName == nnBoneHierarchy ||
          m_currentNodeName == nnAnimations    ||
          m_currentNodeName == nnAnimationLinks)
    {
        if (m_currentNodeName == nnBones)
            ReadBones(skeleton);
        else if (m_currentNodeName == nnBoneHierarchy)
            ReadBoneHierarchy(skeleton);
        else if (m_currentNodeName == nnAnimations)
            ReadAnimations(skeleton);
        else
            SkipCurrentNode();
    }
}